

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu_registers.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3b725a::RegisterUint8_shift_left_Test::~RegisterUint8_shift_left_Test
          (RegisterUint8_shift_left_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RegisterUint8, shift_left) {
    Register<uint8_t> reg;
    reg.set_bit(0);
    reg <<= 1u;
    EXPECT_EQ(0b0000'0010, reg.value());

    reg = reg << 1u;
    EXPECT_EQ(0b0000'0100, reg.value());
}